

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O0

bool __thiscall QLibraryPrivate::unload(QLibraryPrivate *this,UnloadFlag flag)

{
  bool bVar1;
  int iVar2;
  Type pvVar3;
  QObject *pQVar4;
  QLoggingCategory *this_00;
  QMessageLogger *this_01;
  int in_ESI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QMutexLocker<QMutex> locker;
  QLoggingCategory *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  QString *in_stack_ffffffffffffff48;
  QMessageLogger *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  byte local_51;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar3 = QBasicAtomicPointer<void>::loadRelaxed((QBasicAtomicPointer<void> *)0x8c2ec8);
  if (pvVar3 == (Type)0x0) {
    local_51 = 0;
  }
  else {
    iVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x8c2ee9);
    if ((0 < iVar2) &&
       (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x8c2f03), !bVar1)) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QMutexLocker<QMutex>::QMutexLocker
                ((QMutexLocker<QMutex> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (QMutex *)in_stack_ffffffffffffff38);
      pQVar4 = QPointer<QObject>::data((QPointer<QObject> *)0x8c2f4d);
      if (pQVar4 != (QObject *)0x0) {
        (*pQVar4->_vptr_QObject[4])();
      }
      if ((in_ESI == 1) ||
         (bVar1 = unload_sys((QLibraryPrivate *)
                             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)), bVar1))
      {
        local_28 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
        this_00 = lcDebugLibrary();
        anon_unknown.dwarf_146765a::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
          this_01 = (QMessageLogger *)
                    anon_unknown.dwarf_146765a::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x8c2fe5);
          QMessageLogger::QMessageLogger
                    (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
                     in_stack_ffffffffffffff44,(char *)in_stack_ffffffffffffff38,(char *)0x8c3002);
          QMessageLogger::debug(this_01);
          in_stack_ffffffffffffff50 =
               (QMessageLogger *)
               QDebug::operator<<((QDebug *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          in_stack_ffffffffffffff48 =
               (QString *)
               QDebug::operator<<((QDebug *)this_00,
                                  (char *)CONCAT44(in_ESI,in_stack_ffffffffffffff98));
          QDebug::operator<<((QDebug *)this_00,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffff98));
          QDebug::~QDebug((QDebug *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          puStack_20 = (undefined1 *)((ulong)puStack_20 & 0xffffffffffffff00);
        }
        QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x8c30d1);
        QBasicAtomicPointer<void>::storeRelaxed
                  ((QBasicAtomicPointer<void> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
        QBasicAtomicPointer<QObject_*()>::storeRelaxed
                  ((QBasicAtomicPointer<QObject_*()> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (Type)in_stack_ffffffffffffff38);
        local_51 = 1;
        iVar2 = 1;
      }
      else {
        iVar2 = 0;
      }
      QMutexLocker<QMutex>::~QMutexLocker
                ((QMutexLocker<QMutex> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      if (iVar2 != 0) goto LAB_008c313b;
    }
    local_51 = 0;
  }
LAB_008c313b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_51 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QLibraryPrivate::unload(UnloadFlag flag)
{
    if (!pHnd.loadRelaxed())
        return false;
    if (libraryUnloadCount.loadRelaxed() > 0 && !libraryUnloadCount.deref()) { // only unload if ALL QLibrary instance wanted to
        QMutexLocker locker(&mutex);
        delete inst.data();
        if (flag == NoUnloadSys || unload_sys()) {
            qCDebug(lcDebugLibrary) << fileName << "unloaded library"
                                    << (flag == NoUnloadSys ? "(faked)" : "");
            // when the library is unloaded, we release the reference on it so that 'this'
            // can get deleted
            libraryRefCount.deref();
            pHnd.storeRelaxed(nullptr);
            instanceFactory.storeRelaxed(nullptr);
            return true;
        }
    }

    return false;
}